

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack12_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0xfff;
  out[1] = uVar1 >> 0xc & 0xfff;
  out[2] = uVar1 >> 0x18;
  uVar2 = in[1];
  out[2] = uVar1 >> 0x18 | (uVar2 & 0xf) << 8;
  auVar5 = vpbroadcastd_avx512vl();
  auVar6._8_8_ = 0x1000000004;
  auVar6._0_8_ = 0x1000000004;
  auVar5 = vpsrlvd_avx2(auVar5,auVar6);
  auVar7._8_4_ = 0xfff;
  auVar7._0_8_ = 0xfff00000fff;
  auVar7._12_4_ = 0xfff;
  auVar5 = vpand_avx(auVar5,auVar7);
  *(long *)(out + 3) = auVar5._0_8_;
  uVar3 = *(ulong *)(in + 2);
  out[5] = uVar2 >> 0x1c;
  out[5] = uVar2 >> 0x1c | ((uint)uVar3 & 0xff) << 4;
  out[6] = (uint)uVar3 >> 8 & 0xfff;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar5 = vpinsrd_avx(auVar5,(uint)(uVar3 >> 0x2c),2);
  auVar8 = vpshufd_avx(auVar5,100);
  auVar4 = vpmovsxwd_avx(ZEXT816(0x180fff0fff0014));
  auVar8 = vpsrlvd_avx2(auVar8,auVar4);
  auVar5 = vpand_avx(auVar5,auVar7);
  auVar5 = vpblendd_avx2(auVar8,auVar5,6);
  *(undefined1 (*) [16])(out + 7) = auVar5;
  uVar1 = in[4];
  out[10] = auVar8._12_4_ | (uVar1 & 0xf) << 8;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,auVar6);
  auVar5 = vpand_avx(auVar5,auVar7);
  *(long *)(out + 0xb) = auVar5._0_8_;
  uVar3 = *(ulong *)(in + 5);
  out[0xd] = uVar1 >> 0x1c;
  out[0xd] = uVar1 >> 0x1c | ((uint)uVar3 & 0xff) << 4;
  out[0xe] = (uint)uVar3 >> 8 & 0xfff;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar5 = vpinsrd_avx(auVar8,(uint)(uVar3 >> 0x2c),2);
  auVar8 = vpshufd_avx(auVar5,100);
  auVar4 = vpsrlvd_avx2(auVar8,auVar4);
  auVar5 = vpand_avx(auVar5,auVar7);
  auVar5 = vpblendd_avx2(auVar4,auVar5,6);
  *(undefined1 (*) [16])(out + 0xf) = auVar5;
  uVar1 = in[7];
  out[0x12] = auVar4._12_4_ | (uVar1 & 0xf) << 8;
  auVar5 = vpbroadcastd_avx512vl();
  auVar5 = vpsrlvd_avx2(auVar5,auVar6);
  auVar5 = vpand_avx(auVar5,auVar7);
  *(long *)(out + 0x13) = auVar5._0_8_;
  out[0x15] = uVar1 >> 0x1c;
  uVar2 = in[8];
  out[0x15] = uVar1 >> 0x1c | (uVar2 & 0xff) << 4;
  out[0x16] = uVar2 >> 8 & 0xfff;
  out[0x17] = uVar2 >> 0x14;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack12_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 12);
  out++;
  *out = ((*in) >> 12) % (1U << 12);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 4)) << (12 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 12);
  out++;
  *out = ((*in) >> 16) % (1U << 12);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 8)) << (12 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 12);
  out++;
  *out = ((*in) >> 20);
  ++in;
  out++;

  return in;
}